

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDFATest.cpp
# Opt level: O0

void __thiscall
Microsoft::VisualStudio::CppUnitTestFramework::LDFATest::LDFAConstructionTest(LDFATest *this)

{
  int iVar1;
  int local_100;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  int local_d4;
  undefined1 local_d0 [4];
  int lookup_result;
  ATNPath local_a8;
  undefined1 local_88 [8];
  LookaheadDFA<char> ldfa;
  undefined1 local_58 [8];
  CompositeATN<char> catn;
  LDFATest *this_local;
  
  catn.m_dict._M_h._M_single_bucket = (__node_base_ptr)this;
  Logger::WriteMessage("Starting test.\n");
  LoadCATN((CompositeATN<char> *)local_58,"../../grammar/json.cgr");
  Logger::WriteMessage("CATN loaded.\n");
  Centaurus::Identifier::Identifier((Identifier *)local_d0,L"Object");
  Centaurus::ATNPath::ATNPath(&local_a8,(Identifier *)local_d0,0);
  Centaurus::LookaheadDFA<char>::LookaheadDFA
            ((LookaheadDFA<char> *)local_88,(CompositeATN<char> *)local_58,&local_a8,true);
  Centaurus::ATNPath::~ATNPath(&local_a8);
  Centaurus::Identifier::~Identifier((Identifier *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"{}",&local_f9);
  iVar1 = Centaurus::LookaheadDFA<char>::run((LookaheadDFA<char> *)local_88,&local_f8,0,0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_100 = 4;
  local_d4 = iVar1;
  Assert::AreEqual<int>(&local_100,&local_d4,(wchar_t *)0x0);
  Centaurus::LookaheadDFA<char>::~LookaheadDFA((LookaheadDFA<char> *)local_88);
  Centaurus::CompositeATN<char>::~CompositeATN((CompositeATN<char> *)local_58);
  return;
}

Assistant:

TEST_METHOD(LDFAConstructionTest)
	{
        Logger::WriteMessage("Starting test.\n");

		Centaurus::CompositeATN<char> catn = LoadCATN("../../grammar/json.cgr");

        Logger::WriteMessage("CATN loaded.\n");

		Centaurus::LookaheadDFA<char> ldfa(catn, Centaurus::ATNPath(L"Object", 0));

		int lookup_result = ldfa.run("{}", 0, 0);

		Assert::AreEqual(4, lookup_result);
	}